

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

int merged(int lA,int lB)

{
  instrStruct *local_28;
  instrStruct *element;
  int lD;
  int lC;
  int lB_local;
  int lA_local;
  
  lB_local = lB;
  if (lA != 0) {
    local_28 = getInstruction(lA);
    element._4_4_ = local_28->instr % bigNum;
    while (element._4_4_ != 0) {
      local_28 = getInstruction(element._4_4_);
      element._4_4_ = local_28->instr % bigNum;
    }
    local_28->instr = local_28->instr + lB;
    lB_local = lA;
  }
  return lB_local;
}

Assistant:

procedure 
int merged(int lA, int lB) {
	variable int lC; variable int lD;
	variable struct instrStruct *element;
	lC = 0; lD = 0;
	if (lA != 0) {
		lC = lA;
		element = getInstruction(lC);
		lD = element->instr % bigNum;
		while (lD != 0) {
			lC = lD;
			element = getInstruction(lC);
			lD = element->instr % bigNum;
		}
		element->instr = element->instr - lD + lB;
		return lA;
	}
	return lB;
}